

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall
adios2::transport::FilePOSIX::Open
          (FilePOSIX *this,string *name,Mode openMode,bool async,bool directio)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  byte in_CL;
  undefined4 in_EDX;
  string *in_RSI;
  bool *in_RDI;
  byte in_R8B;
  type lf_AsyncOpenWrite;
  char *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  Transport *in_stack_fffffffffffffde0;
  Transport *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  allocator *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe48;
  type *in_stack_fffffffffffffe50;
  launch in_stack_fffffffffffffe5c;
  string local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [8];
  string *in_stack_fffffffffffffeb8;
  FilePOSIX *in_stack_fffffffffffffec0;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  undefined1 local_100 [39];
  undefined1 local_d9 [40];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [58];
  byte local_16;
  byte local_15;
  undefined1 local_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  
  local_15 = in_CL & 1;
  local_16 = in_R8B & 1;
  _local_14 = in_EDX;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x48),in_RSI);
  (**(code **)(*(long *)in_RDI + 0x98))();
  in_RDI[0x110] = (bool)(local_16 & 1);
  in_RDI[0x68] = (bool)local_14;
  in_RDI[0x69] = (bool)uStack_13;
  in_RDI[0x6a] = (bool)uStack_12;
  in_RDI[0x6b] = (bool)uStack_11;
  iVar1 = *(int *)(in_RDI + 0x68);
  if (iVar1 == 1) {
    if ((local_15 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"open",&local_51);
      Transport::ProfilerStart(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      piVar2 = __errno_location();
      *piVar2 = 0;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iVar1 = __GetOpenFlag(0x241,(bool)(local_16 & 1));
      iVar1 = open(pcVar3,iVar1,0x1b6);
      *(int *)(in_RDI + 0xf0) = iVar1;
      piVar2 = __errno_location();
      *(int *)(in_RDI + 0xf4) = *piVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"open",&local_89);
      Transport::ProfilerStop(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    else {
      in_RDI[0xf9] = true;
      std::
      async<adios2::transport::FilePOSIX::Open(std::__cxx11::string_const&,adios2::Mode,bool,bool)::__0&,std::__cxx11::string_const&,bool_const&>
                (in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(1,in_stack_fffffffffffffe48),in_RDI);
      std::future<int>::operator=
                ((future<int> *)in_stack_fffffffffffffde0,(future<int> *)in_stack_fffffffffffffdd8);
      std::future<int>::~future((future<int> *)0xd77588);
    }
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_100,"open",&local_101);
    this_00 = (Transport *)local_100;
    Transport::ProfilerStart(this_00,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string((string *)this_00);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = open(pcVar3,0);
    *(int *)(in_RDI + 0xf0) = iVar1;
    piVar2 = __errno_location();
    *(int *)(in_RDI + 0xf4) = *piVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"open",&local_129);
    Transport::ProfilerStop(this_00,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  else if (iVar1 == 3) {
    in_stack_fffffffffffffe18 = &local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"open",in_stack_fffffffffffffe18);
    Transport::ProfilerStart(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = __GetOpenFlag(0x42,(bool)(local_16 & 1));
    iVar1 = open(pcVar3,iVar1,0x1ff);
    *(int *)(in_RDI + 0xf0) = iVar1;
    lseek(*(int *)(in_RDI + 0xf0),0,2);
    piVar2 = __errno_location();
    *(int *)(in_RDI + 0xf4) = *piVar2;
    in_stack_fffffffffffffe10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_d9 + 1),"open",(allocator *)in_stack_fffffffffffffe10);
    Transport::ProfilerStop(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string((string *)(local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
  }
  else {
    in_stack_fffffffffffffdd8 = &local_170;
    std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    CheckFile(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  if ((in_RDI[0xf9] & 1U) == 0) {
    pcVar3 = &stack0xfffffffffffffe50;
    std::operator+((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::operator+(in_stack_fffffffffffffdd8,pcVar3);
    CheckFile(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
    in_RDI[0x6c] = true;
  }
  return;
}

Assistant:

void FilePOSIX::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name, const bool directio) -> int {
        ProfilerStart("open");
        errno = 0;
        int flag = __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio);
        int FD = open(m_Name.c_str(), flag, 0666);
        m_Errno = errno;
        ProfilerStop("open");
        return FD;
    };

    m_Name = name;
    CheckName();
    m_DirectIO = directio;
    m_OpenMode = openMode;
    switch (m_OpenMode)
    {

    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name, directio);
        }
        else
        {
            ProfilerStart("open");
            errno = 0;
            m_FileDescriptor =
                open(m_Name.c_str(),
                     __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio), 0666);
            m_Errno = errno;
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor =
            open(m_Name.c_str(), __GetOpenFlag(O_RDWR | O_CREAT | O_BINARY, directio), 0777);
        lseek(m_FileDescriptor, 0, SEEK_END);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor = open(m_Name.c_str(), O_RDONLY | O_BINARY);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to POSIX open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}